

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
 tf::detail::
 partition_right<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *begin,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *end)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  this;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_01;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar3;
  T pivot;
  
  std::__cxx11::string::string((string *)&pivot,(string *)begin);
  lVar2 = 0x20;
  __lhs_01 = begin;
  do {
    __lhs_01 = __lhs_01 + 1;
    bVar1 = std::operator<(__lhs_01,&pivot);
    lVar2 = lVar2 + -0x20;
  } while (bVar1);
  if (lVar2 == 0) {
    do {
      if (end <= __lhs_01) break;
      end = end + -1;
      bVar1 = std::operator<(end,&pivot);
    } while (!bVar1);
  }
  else {
    do {
      end = end + -1;
      bVar1 = std::operator<(end,&pivot);
    } while (!bVar1);
  }
  __lhs = end;
  __lhs_00 = __lhs_01;
  while (__lhs_00 < __lhs) {
    std::__cxx11::string::swap((string *)__lhs_00);
    do {
      __lhs_00 = __lhs_00 + 1;
      bVar1 = std::operator<(__lhs_00,&pivot);
    } while (bVar1);
    do {
      __lhs = __lhs + -1;
      bVar1 = std::operator<(__lhs,&pivot);
    } while (!bVar1);
  }
  this._M_current = __lhs_00 + -1;
  std::__cxx11::string::operator=((string *)begin,(string *)this._M_current);
  std::__cxx11::string::operator=((string *)this._M_current,(string *)&pivot);
  std::__cxx11::string::~string((string *)&pivot);
  pVar3._8_8_ = CONCAT71((int7)((ulong)__lhs >> 8),end <= __lhs_01) & 0xffffffff;
  pVar3.first._M_current = this._M_current;
  return pVar3;
}

Assistant:

std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {

  using T = typename std::iterator_traits<Iter>::value_type;

  // Move pivot into local for speed.
  T pivot(std::move(*begin));

  Iter first = begin;
  Iter last = end;

  // Find the first element greater than or equal than the pivot
  // (the median of 3 guarantees/ this exists).
  while (comp(*++first, pivot));

  // Find the first element strictly smaller than the pivot.
  // We have to guard this search if there was no element before *first.
  if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
  else while (!comp(*--last, pivot));

  // If the first pair of elements that should be swapped to partition
  // are the same element, the passed in sequence already was correctly
  // partitioned.
  bool already_partitioned = first >= last;

  // Keep swapping pairs of elements that are on the wrong side of the pivot.
  // Previously swapped pairs guard the searches,
  // which is why the first iteration is special-cased above.
  while (first < last) {
    std::iter_swap(first, last);
    while (comp(*++first, pivot));
    while (!comp(*--last, pivot));
  }

  // Put the pivot in the right place.
  Iter pivot_pos = first - 1;
  *begin = std::move(*pivot_pos);
  *pivot_pos = std::move(pivot);

  return std::make_pair(pivot_pos, already_partitioned);
}